

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_connection.c
# Opt level: O3

void apx_socketServerConnection_vtransmit_begin(void *arg)

{
  long lVar1;
  uint uVar2;
  
  if (arg != (void *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)((long)arg + 0x5d8));
    lVar1 = (long)arg + 0x5b0;
    uVar2 = adt_bytearray_length(lVar1);
    if (uVar2 < *(uint *)((long)arg + 0x5c8)) {
      adt_bytearray_resize(lVar1);
    }
    *(undefined4 *)((long)arg + 0x5cc) = 0;
    uVar2 = adt_bytearray_length(lVar1);
    if (uVar2 < *(uint *)((long)arg + 0x5c8)) {
      __assert_fail("(adt_bytearray_length(&self->send_buffer) >= self->default_buffer_size)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/extension/socket_server_connection.c"
                    ,0x14f,"void connection_transmit_begin(apx_socketServerConnection_t *)");
    }
  }
  return;
}

Assistant:

static void connection_transmit_begin(apx_socketServerConnection_t* self)
{
   if (self != NULL)
   {
      MUTEX_LOCK(self->lock);
      if (adt_bytearray_length(&self->send_buffer) < self->default_buffer_size)
      {
         adt_bytearray_resize(&self->send_buffer, self->default_buffer_size);
      }
      self->pending_bytes = 0u;
      assert((adt_bytearray_length(&self->send_buffer) >= self->default_buffer_size));
   }
}